

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void ParseLabel(void)

{
  aint value;
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  reference pvVar5;
  size_type sVar6;
  reference b;
  char *pcVar7;
  uint uVar8;
  uint uVar9;
  int local_89c;
  char local_88d;
  int local_88c;
  char *buf;
  SLabelTableEntry *label;
  uint traits;
  char *n;
  char *p;
  int gl;
  bool IsEQU;
  bool IsDEFL;
  value_type *smartSmcLine;
  aint local_820;
  aint smcOffset;
  aint equPageNum;
  aint val;
  char *ttp;
  char *tp;
  char temp [2048];
  
  bVar1 = White();
  if (bVar1) {
    return;
  }
  if (((Options::syx & 1) != 0) && (iVar3 = ParseDirective(true), iVar3 != 0)) {
    iVar3 = SkipBlanks();
    if (iVar3 != 0) {
      return;
    }
    Error("Unexpected",lp,PASS3);
    return;
  }
  ttp = (char *)&tp;
  local_820 = -1;
  smartSmcLine._4_4_ = 0;
  while( true ) {
    bVar1 = false;
    if (*lp != '\0') {
      bVar2 = White();
      bVar1 = false;
      if (((!bVar2) && (bVar1 = false, *lp != ':')) && (bVar1 = false, *lp != '=')) {
        bVar1 = *lp != '+';
      }
    }
    if (!bVar1) break;
    *ttp = *lp;
    ttp = ttp + 1;
    lp = lp + 1;
  }
  *ttp = '\0';
  if (((*lp == '+') && (iVar3 = isdigit((uint)(byte)lp[1]), iVar3 != 0)) &&
     (iVar3 = isalnum((uint)(byte)lp[2]), iVar3 == 0)) {
    smartSmcLine._4_4_ = (int)lp[1] - 0x30;
    lp = lp + 2;
  }
  if (((*lp != '+') || (lp[1] != '*')) || (iVar3 = isalnum((uint)(byte)lp[2]), iVar3 != 0))
  goto LAB_001340d0;
  bVar1 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::empty(&sourcePosStack);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!sourcePosStack.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/parser.cpp"
                  ,0x283,"void ParseLabel()");
  }
  smartSmcLine._4_4_ = 1;
  lp = lp + 2;
  if (pass == 1) {
    pvVar5 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::back(&sourcePosStack);
    std::vector<TextFilePos,_std::allocator<TextFilePos>_>::push_back(&smartSmcLines,pvVar5);
    pvVar5 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::back(&smartSmcLines);
    pvVar5->colBegin = 0xffffffff;
  }
  else {
    sVar6 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::size(&smartSmcLines);
    if (smartSmcIndex < sVar6) {
      pvVar5 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::at
                         (&smartSmcLines,smartSmcIndex);
      b = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::back(&sourcePosStack);
      bVar1 = TextFilePos::operator!=(pvVar5,b);
      if (!bVar1) {
        _gl = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::at
                        (&smartSmcLines,smartSmcIndex);
        if (_gl->colBegin == 0xffffffff) {
          Error("unresolved smart-SMC symbol (no significant target)",(char *)0x0,PASS3);
        }
        else {
          smartSmcLine._4_4_ = _gl->colBegin;
          _gl->colBegin = 0xffffffff;
        }
        goto LAB_001340b8;
      }
    }
    Error("mismatch of smart-SMC positions between passes",(char *)0x0,PASS3);
  }
LAB_001340b8:
  smartSmcIndex = smartSmcIndex + 1;
LAB_001340d0:
  if (*lp == ':') {
    lp = lp + 1;
  }
  ttp = (char *)&tp;
  SkipBlanks();
  IsLabelNotFound = false;
  iVar3 = isdigit((uint)(byte)*ttp);
  if (iVar3 == 0) {
    bVar1 = isMacroNext();
    if (bVar1) {
      if (smartSmcLine._4_4_ == 0) {
        SetLastParsedLabel(ttp);
      }
      else {
        Error("Macro name can\'t use SMC-offset",(char *)0x0,PASS3);
      }
    }
    else {
      iVar3 = NeedDEFL();
      p._7_1_ = iVar3 != 0;
      iVar3 = NeedEQU();
      p._6_1_ = iVar3 != 0;
      if (((p._7_1_ & 1) != 0) || ((bool)p._6_1_)) {
        Relocation::isResultAffected = 0;
        iVar3 = ParseExpressionNoSyntaxError(&lp,&smcOffset);
        if (iVar3 == 0) {
          Error("Expression error",lp,PASS3);
          smcOffset = 0;
        }
        if (((IsLabelNotFound & 1U) != 0) && ((p._7_1_ & 1) != 0)) {
          Error("Forward reference",(char *)0x0,EARLY);
        }
        if ((((p._6_1_ & 1) != 0) && (bVar1 = comma(&lp), bVar1)) &&
           (iVar3 = ParseExpressionNoSyntaxError(&lp,&local_820), iVar3 == 0)) {
          Error("Expression error",lp,PASS3);
          local_820 = -1;
        }
        iVar3 = SkipBlanks(&lp);
        if (iVar3 == 0) {
          Error("Unexpected",lp,PASS3);
          SkipToEol(&lp);
        }
      }
      else {
        p._0_4_ = 0;
        n = lp;
        SkipBlanks(&n);
        if (*n == '@') {
          n = n + 1;
          p._0_4_ = 1;
        }
        pcVar7 = GetID(&n);
        if ((pcVar7 != (char *)0x0) &&
           (iVar3 = CStructureTable::Emit(&StructureTable,pcVar7,ttp,&n,(int)p), iVar3 != 0)) {
          if (smartSmcLine._4_4_ != 0) {
            Error("Structure instance can\'t use SMC-offset",(char *)0x0,PASS3);
          }
          lp = n;
          ttp = ValidateLabel(ttp,true,false);
          if (ttp == (char *)0x0) {
            return;
          }
          if (ttp == (char *)0x0) {
            return;
          }
          operator_delete__(ttp);
          return;
        }
        smcOffset = CurAddress;
      }
      smcOffset = smartSmcLine._4_4_ + smcOffset;
      _equPageNum = (byte *)ttp;
      ttp = ValidateLabel(ttp,true,false);
      if (ttp != (char *)0x0) {
        if ((p._7_1_ & 1) == 0) {
          SetLastParsedLabel(ttp);
        }
        uVar4 = 0;
        if ((p._6_1_ & 1) != 0) {
          uVar4 = 4;
        }
        uVar8 = 0;
        if ((p._7_1_ & 1) != 0) {
          uVar8 = 2;
        }
        uVar9 = 0;
        if (smartSmcLine._4_4_ != 0) {
          uVar9 = 0x80;
        }
        uVar9 = uVar4 | uVar8 | uVar9;
        if (pass == 3) {
          buf = (char *)CLabelTable::Find(&LabelTable,ttp,true);
          if ((((SLabelTableEntry *)buf == (SLabelTableEntry *)0x0) && ((p._7_1_ & 1) != 0)) &&
             (iVar3 = CLabelTable::Insert(&LabelTable,ttp,smcOffset,uVar9,-1), iVar3 != 0)) {
            buf = (char *)CLabelTable::Find(&LabelTable,ttp,true);
          }
          if (buf == (char *)0x0) {
            Error("Label not found",ttp,PASS3);
            if (ttp == (char *)0x0) {
              return;
            }
            operator_delete__(ttp);
            return;
          }
          if ((p._7_1_ & 1) == 0) {
            bVar1 = IsSldExportActive();
            if (bVar1) {
              if ((p._6_1_ & 1) == 0) {
                local_88c = (int)*(short *)(buf + 8);
              }
              else {
                local_88c = -1;
              }
              local_88d = 'D';
              if ((p._6_1_ & 1) == 0) {
                local_88d = 'F';
              }
              WriteToSldFile(local_88c,smcOffset,local_88d,ttp);
              value = smcOffset;
              if ((p._6_1_ & 1) == 0) {
                local_89c = (int)*(short *)(buf + 8);
              }
              else {
                local_89c = -1;
              }
              pcVar7 = ExportLabelToSld((char *)_equPageNum,(SLabelTableEntry *)buf);
              WriteToSldFile(local_89c,value,'L',pcVar7);
            }
          }
          else {
            CLabelTable::Insert(&LabelTable,ttp,smcOffset,uVar9,-1);
          }
          if (smcOffset == *(int *)buf) {
            *(int *)(buf + 4) = pass;
          }
          else {
            pcVar7 = (char *)operator_new__(0x800);
            snprintf(pcVar7,0x800,"previous value %u not equal %u",(ulong)*(uint *)buf,
                     (ulong)(uint)smcOffset);
            Warning("Label has different value in pass 3",pcVar7,W_PASS3);
            CLabelTable::Update(&LabelTable,ttp,smcOffset);
            if (pcVar7 != (char *)0x0) {
              operator_delete__(pcVar7);
            }
          }
        }
        else if ((pass == 2) &&
                (iVar3 = CLabelTable::Insert(&LabelTable,ttp,smcOffset,uVar9,(short)local_820),
                iVar3 == 0)) {
          iVar3 = CLabelTable::Update(&LabelTable,ttp,smcOffset);
          if (iVar3 == 0) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/parser.cpp"
                          ,0x307,"void ParseLabel()");
          }
        }
        else if ((pass == 1) &&
                (iVar3 = CLabelTable::Insert(&LabelTable,ttp,smcOffset,uVar9,(short)local_820),
                iVar3 == 0)) {
          Error("Duplicate label",ttp,EARLY);
        }
        if (ttp != (char *)0x0) {
          operator_delete__(ttp);
        }
      }
    }
  }
  else if (smartSmcLine._4_4_ == 0) {
    _equPageNum = (byte *)ttp;
    while( true ) {
      bVar1 = false;
      if (*_equPageNum != 0) {
        iVar3 = isdigit((uint)*_equPageNum);
        bVar1 = iVar3 != 0;
      }
      if (!bVar1) break;
      _equPageNum = _equPageNum + 1;
    }
    if (*_equPageNum == 0) {
      iVar3 = NeedEQU();
      if ((iVar3 == 0) && (iVar3 = NeedDEFL(), iVar3 == 0)) {
        smcOffset = atoi(ttp);
        bVar1 = CTemporaryLabelTable::InsertRefresh(&TemporaryLabelTable,smcOffset);
        if (!bVar1) {
          Error("Temporary labels flow differs in this pass (missing/new temporary label or final pass source difference)"
                ,(char *)0x0,PASS3);
        }
      }
      else {
        Error("Number labels are allowed as address labels only, not for DEFL/=/EQU",(char *)&tp,
              SUPPRESS);
      }
    }
    else {
      Error("Invalid temporary label (not a number)",(char *)&tp,PASS3);
    }
  }
  else {
    Error("Temporary label can\'t use SMC-offset",(char *)0x0,PASS3);
  }
  return;
}

Assistant:

void ParseLabel() {
	if (White()) return;
	if (Options::syx.IsPseudoOpBOF && ParseDirective(true)) {
		if (!SkipBlanks()) Error("Unexpected", lp);
		return;
	}
	char temp[LINEMAX], * tp = temp, * ttp;
	aint val, equPageNum = LABEL_PAGE_UNDEFINED, smcOffset = 0;
	// copy the label name into `temp` array
	while (*lp && !White() && *lp != ':' && *lp != '=' && *lp != '+') {
		*tp = *lp; ++tp; ++lp;
	}
	*tp = 0;
	// handle the special SMC_offset syntax "<label>+<single_digit>"
	if ('+' == lp[0] && isdigit(byte(lp[1])) && !isalnum(byte(lp[2]))) {
		smcOffset = lp[1] - '0';
		lp += 2;
	}
	// handle the special SMC_offset syntax "<label>+*" to target significant immediate of the instruction
	if ('+' == lp[0] && '*' == lp[1] && !isalnum(byte(lp[2]))) {
		assert(!sourcePosStack.empty());
		smcOffset = 1;					// heuristic value 1 for first pass or when something fails
		lp += 2;
		if (1 == pass) {
			// put the current source position into smart-smc (if first pass, or missing record)
			smartSmcLines.push_back(sourcePosStack.back());
			smartSmcLines.back().colBegin = ~0U;		// mark as unresolved
		} else {
			if ((smartSmcLines.size() <= smartSmcIndex)
				|| smartSmcLines.at(smartSmcIndex) != sourcePosStack.back()) {
				Error("mismatch of smart-SMC positions between passes");
			} else {
				auto & smartSmcLine = smartSmcLines.at(smartSmcIndex);
				if (~0U == smartSmcLine.colBegin) {
					Error("unresolved smart-SMC symbol (no significant target)");
				} else {
					smcOffset = smartSmcLine.colBegin;	// use the smart value from previous pass
					smartSmcLine.colBegin = ~0U;		// mark as unsolved again
				}
			}
		}
		++smartSmcIndex;
	}
	if (*lp == ':') ++lp;	// eat the optional colon after label
	tp = temp;
	SkipBlanks();
	IsLabelNotFound = false;
	if (isdigit((byte)*tp)) {
		if (smcOffset) {
			Error("Temporary label can't use SMC-offset");
			return;
		}
		ttp = tp;
		while (*ttp && isdigit((byte)*ttp)) ++ttp;
		if (*ttp) {
			Error("Invalid temporary label (not a number)", temp);
			return;
		}
		if (NeedEQU() || NeedDEFL()) {
			Error("Number labels are allowed as address labels only, not for DEFL/=/EQU", temp, SUPPRESS);
			return;
		}
		val = atoi(tp);
		if (!TemporaryLabelTable.InsertRefresh(val)) {
			Error("Temporary labels flow differs in this pass (missing/new temporary label or final pass source difference)");
		}
	} else {
		if (isMacroNext()) {
			if (smcOffset) Error("Macro name can't use SMC-offset");
			else SetLastParsedLabel(tp);	// store raw label into "last parsed" without adding module/etc
			return;					// and don't add it to labels table at all
		}
		bool IsDEFL = NeedDEFL(), IsEQU = NeedEQU();
		if (IsDEFL || IsEQU) {
			Relocation::isResultAffected = false;
			if (!ParseExpressionNoSyntaxError(lp, val)) {
				Error("Expression error", lp);
				val = 0;
			}
			if (IsLabelNotFound && IsDEFL) Error("Forward reference", NULL, EARLY);
			// check for explicit page defined by EQU
			if (IsEQU && comma(lp)) {
				if (!ParseExpressionNoSyntaxError(lp, equPageNum)) {
					Error("Expression error", lp);
					equPageNum = LABEL_PAGE_UNDEFINED;
				}
			}

			// after EQU/DEFL expressions there must be <EOL>, anything else is syntax error
			// this was added in v1.17.1 after realizing the line `label=$+1 and 7`
			// does evaluate whole "$+1 and 7" as expression, not as instruction `and`
			// (same problem exists with and/or/xor and if you have macro named after operator)
			if (!SkipBlanks(lp)) {
				Error("Unexpected", lp);
				SkipToEol(lp);
			}

		} else {
			int gl = 0;
			char* p = lp,* n;
			SkipBlanks(p);
			if (*p == '@') {
				++p; gl = 1;
			}
			if ((n = GetID(p)) && StructureTable.Emit(n, tp, p, gl)) {
				if (smcOffset) Error("Structure instance can't use SMC-offset");
				lp = p;
				// this was instancing STRUCT, make it also define "main" label for future "local" ones
				tp = ValidateLabel(tp, true);
				if (tp) delete[] tp;
				return;
			}
			val = CurAddress;
		}
		val += smcOffset;
		ttp = tp;
		if (!(tp = ValidateLabel(tp, true))) {
			return;
		}
		// Copy label name to last parsed label variable
		if (!IsDEFL) SetLastParsedLabel(tp);
		unsigned traits = (IsEQU ? LABEL_IS_EQU : 0) | (IsDEFL ? LABEL_IS_DEFL : 0) | (smcOffset ? LABEL_IS_SMC : 0);
		if (pass == LASTPASS) {
			SLabelTableEntry* label = LabelTable.Find(tp, true);
			if (nullptr == label && IsDEFL) {	// DEFL labels can be defined as late as needed (including pass3)
				if (LabelTable.Insert(tp, val, traits)) label = LabelTable.Find(tp, true);
			}
			if (nullptr == label) {		// should have been already defined before last pass
				Error("Label not found", tp);
				delete[] tp;
				return;
			}
			if (IsDEFL) {		//re-set DEFL value
				LabelTable.Insert(tp, val, traits);
			} else if (IsSldExportActive()) {
				// SLD (Source Level Debugging) tracing-data logging
				WriteToSldFile(IsEQU ? -1 : label->page, val, IsEQU ? 'D' : 'F', tp);	//version 0
				WriteToSldFile(IsEQU ? -1 : label->page, val, 'L', ExportLabelToSld(ttp, label));	//version 1
			}

			if (val != label->value) {
				char* buf = new char[LINEMAX];

				SPRINTF2(buf, LINEMAX, "previous value %u not equal %u", label->value, val);
				Warning("Label has different value in pass 3", buf);
				LabelTable.Update(tp, val);

				delete[] buf;
			} else {
				label->updatePass = pass;	// just "touch" it here in third pass
			}
		} else if (pass == 2 && !LabelTable.Insert(tp, val, traits, equPageNum)) {
			if (!LabelTable.Update(tp, val)) assert(false); // unreachable, update will always work after insert failed
		} else if (pass == 1 && !LabelTable.Insert(tp, val, traits, equPageNum)) {
			Error("Duplicate label", tp, EARLY);
		}

// TODO v2.x: this is too complicated in current version: Unreal/Cspect already expect
// EQU/DEFL to be current page or "ROM" = not a big deal as they did change in v1.x course already.
// But also struct labels are set as EQU ones, so this has to split, and many other details.
// (will also need more than LABEL_PAGE_UNDEFINED value to deal with more states)
// 		if (IsEQU && comma(lp)) {	// Device extension: "<label> EQU <address>,<page number>"
// 			if (!DeviceID) {
// 				Error("EQU can set page to label only in device mode", line);
// 				SkipToEol(lp);
// 			} else if (!ParseExpression(lp, oval)) {	// try to read page number into "oval"
// 				Error("Expression error", lp);
// 				oval = -1;
// 			} else if (oval < 0 || Device->PagesCount <= oval) {
// 				ErrorInt("Invalid page number", oval);
// 				oval = -1;
// 			} else {
// 				if (val < 0 || 0xFFFF < val) Warning("The EQU address is outside of 16bit range", line);
// 				CLabelTableEntry* equLabel = LabelTable.Find(tp, true);	// must be already defined + found
// 				equLabel->page = oval;			// set it's page number
// 			}
// 		}

		delete[] tp;
	}
}